

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

format_arg * __thiscall
fmt::v7::
basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::get
          (format_arg *__return_storage_ptr__,
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          *this,int id)

{
  longlong *plVar1;
  size_t sVar2;
  ulong uVar3;
  format_arg *pfVar4;
  long lVar5;
  
  (__return_storage_ptr__->value_).field_0.int_value = 0;
  __return_storage_ptr__->type_ = none_type;
  uVar3 = this->desc_;
  if ((long)uVar3 < 0) {
    if ((int)uVar3 <= id) {
      return __return_storage_ptr__;
    }
    pfVar4 = (this->field_1).args_;
    lVar5 = (long)id * 0x20;
    __return_storage_ptr__->type_ = pfVar4[id].type_;
  }
  else {
    if (0xe < id) {
      return __return_storage_ptr__;
    }
    uVar3 = uVar3 >> ((ulong)(uint)(id * 4) & 0x3f);
    __return_storage_ptr__->type_ = (type)uVar3 & custom_type;
    if ((uVar3 & 0xf) == 0) {
      return __return_storage_ptr__;
    }
    pfVar4 = (format_arg *)(this->field_1).values_;
    lVar5 = (long)id << 4;
  }
  plVar1 = (longlong *)((long)&(pfVar4->value_).field_0 + lVar5);
  sVar2 = plVar1[1];
  (__return_storage_ptr__->value_).field_0.long_long_value = *plVar1;
  (__return_storage_ptr__->value_).field_0.string.size = sVar2;
  return __return_storage_ptr__;
}

Assistant:

constexpr FMT_INLINE value(int val = 0) : int_value(val) {}